

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values_prepare.c
# Opt level: O3

double * mpt_values_prepare(mpt_array *arr,long len)

{
  size_t sVar1;
  mpt_type_traits *pmVar2;
  int *piVar3;
  double *pdVar4;
  mpt_buffer *pmVar5;
  size_t __n;
  long lVar6;
  size_t sVar7;
  
  pmVar2 = (mpt_type_traits *)mpt_type_traits(100);
  pmVar5 = arr->_buf;
  if (pmVar5 == (mpt_buffer *)0x0) {
    if (-1 < len) {
      __n = len << 3;
      pmVar5 = (mpt_buffer *)_mpt_buffer_alloc(__n);
      if (pmVar5 != (mpt_buffer *)0x0) {
        arr->_buf = pmVar5;
        pmVar5->_used = __n;
        pmVar5->_content_traits = pmVar2;
        pdVar4 = (double *)memset(pmVar5 + 1,0,__n);
        return pdVar4;
      }
      return (double *)0x0;
    }
  }
  else {
    if (pmVar2 != pmVar5->_content_traits) {
      piVar3 = __errno_location();
      *piVar3 = 0x39;
      return (double *)0x0;
    }
    sVar1 = pmVar5->_used;
    lVar6 = len;
    if ((-1 < len) || (lVar6 = -len, SBORROW8(sVar1,lVar6) == (long)(sVar1 + len) < 0)) {
      sVar7 = lVar6 * 8 + sVar1;
      pmVar5 = (*pmVar5->_vptr->detach)(pmVar5,sVar7);
      if (pmVar5 == (mpt_buffer *)0x0) {
        return (double *)0x0;
      }
      arr->_buf = pmVar5;
      pdVar4 = (double *)((long)&pmVar5[1]._vptr + sVar1);
      if (len < 0) {
        memcpy(pdVar4,(void *)((long)pmVar5 + sVar1 + lVar6 * -8 + 0x20),lVar6 * 8);
      }
      else {
        memset(pdVar4,0,lVar6 * 8);
      }
      pmVar5->_used = sVar7;
      return pdVar4;
    }
  }
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  return (double *)0x0;
}

Assistant:

extern double *mpt_values_prepare(_MPT_ARRAY_TYPE(double) *arr, long len)
{
	const MPT_STRUCT(type_traits) *traits = mpt_type_traits('d');
	MPT_STRUCT(buffer) *buf;
	uint8_t *data;
	size_t add;
	long used;
	
	if (!(buf = arr->_buf)) {
		if (len < 0) {
			errno = EINVAL;
			return 0;
		}
		add = len * sizeof(double);
		if (!(buf = _mpt_buffer_alloc(add, 0))) {
			return 0;
		}
		arr->_buf = buf;
		buf->_used = add;
		buf->_content_traits = traits;
		
		return memset(buf + 1, 0, add);
	}
	/* require typed buffer data */
	if (traits != buf->_content_traits) {
		errno = EBADSLT;
		return 0;
	}
	/* existing size and limit */
	used = buf->_used;
	if (len >= 0) {
		add = len * sizeof(double);
	}
	else if (used < (-len)) {
		errno = EINVAL;
		return 0;
	} else {
		add = (-len) * sizeof(double);
	}
	if (!(buf = buf->_vptr->detach(buf, used + add))) {
		return 0;
	}
	arr->_buf = buf;
	data = (void *) (buf + 1);
	if (len < 0) {
		data = memcpy(data + used, data + (used - add), add);
	} else {
		data = memset(data + used, 0, add);
	}
	buf->_used = used + add;
	return (double *) data;
}